

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

TypeInfo *
dap::TypeOf<std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>_>::type(void)

{
  int iVar1;
  TypeInfo *pTVar2;
  BasicTypeInfo<std::vector<dap::ExceptionOptions,_std::allocator<dap::ExceptionOptions>_>_> *pBVar3
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (TypeOf<std::vector<dap::ExceptionOptions,std::allocator<dap::ExceptionOptions>>>::type()::
      typeinfo == '\0') {
    iVar1 = __cxa_guard_acquire(&TypeOf<std::vector<dap::ExceptionOptions,std::allocator<dap::ExceptionOptions>>>
                                 ::type()::typeinfo);
    if (iVar1 != 0) {
      pTVar2 = TypeOf<dap::ExceptionOptions>::type();
      (*pTVar2->_vptr_TypeInfo[2])(&local_68);
      std::operator+(&local_48,"array<",&local_68);
      std::operator+(&local_28,&local_48,">");
      pBVar3 = TypeInfo::
               create<dap::BasicTypeInfo<std::vector<dap::ExceptionOptions,std::allocator<dap::ExceptionOptions>>>,std::__cxx11::string>
                         (&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      type::typeinfo = pBVar3;
      __cxa_guard_release(&TypeOf<std::vector<dap::ExceptionOptions,std::allocator<dap::ExceptionOptions>>>
                           ::type()::typeinfo);
    }
  }
  return &type::typeinfo->super_TypeInfo;
}

Assistant:

static inline const TypeInfo* type() {
    static auto typeinfo = TypeInfo::create<BasicTypeInfo<array<T>>>(
        "array<" + TypeOf<T>::type()->name() + ">");
    return typeinfo;
  }